

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BooleanStateQueryVerifiers::GetBooleanVerifier::verifyBoolean
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  StateQueryMemoryWriteGuard<unsigned_char> local_19b;
  undefined1 local_198 [384];
  
  local_19b.m_preguard = 0xde;
  local_19b.m_value = 0xde;
  local_19b.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_19b.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_19b,testCtx);
  if ((bVar1) && ((bool)local_19b.m_value != reference)) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    pcVar2 = "GL_FALSE";
    if (reference) {
      pcVar2 = "GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar2,8 - (ulong)reference);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLboolean expectedGLState = reference ? GL_TRUE : GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (reference ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}